

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::initsamplesize(aalcalc *this,string *path)

{
  FILE *__stream;
  char *pcVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool local_d1;
  int local_b8;
  undefined4 local_b4;
  FILE *pFStack_b0;
  int summarycalcstream_type;
  FILE *fin;
  byte local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [55];
  allocator local_49;
  string local_48 [8];
  string s;
  dirent *ent;
  DIR *dir;
  string *path_local;
  aalcalc *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar1);
  if (__dirp != (DIR *)0x0) {
    do {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) {
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pdVar2->d_name,&local_49);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      uVar3 = std::__cxx11::string::length();
      local_81 = 0;
      local_d1 = false;
      if (4 < uVar3) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_80,(ulong)local_48);
        local_81 = 1;
        local_d1 = std::operator==(local_80,".bin");
      }
      if ((local_81 & 1) != 0) {
        std::__cxx11::string::~string((string *)local_80);
      }
      if (local_d1 == false) {
        local_b8 = 0;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                       (char *)path);
        std::__cxx11::string::operator=(local_48,(string *)&fin);
        std::__cxx11::string::~string((string *)&fin);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        pFStack_b0 = fopen(pcVar1,"rb");
        __stream = _stderr;
        if (pFStack_b0 == (FILE *)0x0) {
          uVar4 = std::__cxx11::string::c_str();
          fprintf(__stream,"FATAL:%s: cannot open %s\n","initsamplesize",uVar4);
          exit(1);
        }
        local_b4 = 0;
        fread(&local_b4,4,1,pFStack_b0);
        fread(&this->samplesize_,4,1,pFStack_b0);
        fclose(pFStack_b0);
        local_b8 = 3;
      }
      std::__cxx11::string::~string(local_48);
    } while (local_b8 == 0);
  }
  return;
}

Assistant:

void aalcalc::initsamplesize(const std::string &path)
{
	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				FILE *fin = fopen(s.c_str(), "rb");
				if (fin == NULL) {
					fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
					exit(EXIT_FAILURE);
				}
				int summarycalcstream_type = 0;
				fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
				fread(&samplesize_, sizeof(samplesize_), 1, fin);
				fclose(fin);
				break;
			}

		}
	}
}